

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O0

REF_STATUS ref_face_create(REF_FACE *ref_face_ptr,REF_GRID ref_grid)

{
  uint uVar1;
  REF_FACE pRVar2;
  REF_INT *pRVar3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_CELL ref_cell;
  REF_INT nodes [4];
  REF_INT node;
  REF_INT cell_face;
  REF_INT cell;
  REF_INT group;
  REF_FACE ref_face;
  REF_GRID ref_grid_local;
  REF_FACE *ref_face_ptr_local;
  
  pRVar2 = (REF_FACE)malloc(0x18);
  *ref_face_ptr = pRVar2;
  if (*ref_face_ptr == (REF_FACE)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0x24,
           "ref_face_create","malloc *ref_face_ptr of REF_FACE_STRUCT NULL");
    ref_face_ptr_local._4_4_ = 2;
  }
  else {
    pRVar2 = *ref_face_ptr;
    pRVar2->n = 0;
    pRVar2->max = 10;
    if (pRVar2->max * 4 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0x2b,
             "ref_face_create","malloc ref_face->f2n of REF_INT negative");
      ref_face_ptr_local._4_4_ = 1;
    }
    else {
      pRVar3 = (REF_INT *)malloc((long)(pRVar2->max << 2) << 2);
      pRVar2->f2n = pRVar3;
      if (pRVar2->f2n == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0x2b
               ,"ref_face_create","malloc ref_face->f2n of REF_INT NULL");
        ref_face_ptr_local._4_4_ = 2;
      }
      else {
        ref_face_ptr_local._4_4_ = ref_adj_create(&pRVar2->adj);
        if (ref_face_ptr_local._4_4_ == 0) {
          if (ref_grid->twod == 0) {
            cell_face = 8;
            _ref_private_macro_code_rss_1 = ref_grid->cell[8];
            while (cell_face < 0x10) {
              for (node = 0; node < _ref_private_macro_code_rss_1->max; node = node + 1) {
                if (((-1 < node) && (node < _ref_private_macro_code_rss_1->max)) &&
                   (_ref_private_macro_code_rss_1->c2n
                    [_ref_private_macro_code_rss_1->size_per * node] != -1)) {
                  for (nodes[3] = 0; nodes[3] < _ref_private_macro_code_rss_1->face_per;
                      nodes[3] = nodes[3] + 1) {
                    for (nodes[2] = 0; nodes[2] < 4; nodes[2] = nodes[2] + 1) {
                      nodes[(long)nodes[2] + -2] =
                           _ref_private_macro_code_rss_1->c2n
                           [_ref_private_macro_code_rss_1->f2n[nodes[2] + nodes[3] * 4] +
                            _ref_private_macro_code_rss_1->size_per * node];
                    }
                    uVar1 = ref_face_add_uniquely(pRVar2,(REF_INT *)&ref_cell);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c"
                             ,0x41,"ref_face_create",(ulong)uVar1,"add face");
                      return uVar1;
                    }
                  }
                }
              }
              cell_face = cell_face + 1;
              _ref_private_macro_code_rss_1 = ref_grid->cell[cell_face];
            }
          }
          else {
            cell_face = 3;
            _ref_private_macro_code_rss_1 = ref_grid->cell[3];
            while (cell_face < 8) {
              for (node = 0; node < _ref_private_macro_code_rss_1->max; node = node + 1) {
                if (((-1 < node) && (node < _ref_private_macro_code_rss_1->max)) &&
                   (_ref_private_macro_code_rss_1->c2n
                    [_ref_private_macro_code_rss_1->size_per * node] != -1)) {
                  for (nodes[3] = 0; nodes[3] < _ref_private_macro_code_rss_1->face_per;
                      nodes[3] = nodes[3] + 1) {
                    for (nodes[2] = 0; nodes[2] < 4; nodes[2] = nodes[2] + 1) {
                      nodes[(long)nodes[2] + -2] =
                           _ref_private_macro_code_rss_1->c2n
                           [_ref_private_macro_code_rss_1->f2n[nodes[2] + nodes[3] * 4] +
                            _ref_private_macro_code_rss_1->size_per * node];
                    }
                    uVar1 = ref_face_add_uniquely(pRVar2,(REF_INT *)&ref_cell);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c"
                             ,0x36,"ref_face_create",(ulong)uVar1,"add face");
                      return uVar1;
                    }
                  }
                }
              }
              cell_face = cell_face + 1;
              _ref_private_macro_code_rss_1 = ref_grid->cell[cell_face];
            }
          }
          ref_face_ptr_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",
                 0x2d,"ref_face_create",(ulong)ref_face_ptr_local._4_4_,"create adj");
        }
      }
    }
  }
  return ref_face_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_face_create(REF_FACE *ref_face_ptr, REF_GRID ref_grid) {
  REF_FACE ref_face;
  REF_INT group, cell, cell_face;
  REF_INT node;
  REF_INT nodes[4];
  REF_CELL ref_cell;

  ref_malloc(*ref_face_ptr, 1, REF_FACE_STRUCT);

  ref_face = *ref_face_ptr;

  ref_face_n(ref_face) = 0;
  ref_face_max(ref_face) = 10;

  ref_malloc(ref_face->f2n, 4 * ref_face_max(ref_face), REF_INT);

  RSS(ref_adj_create(&(ref_face_adj(ref_face))), "create adj");

  if (ref_grid_twod(ref_grid)) {
    each_ref_grid_2d_ref_cell(ref_grid, group, ref_cell) {
      each_ref_cell_valid_cell(ref_cell, cell) {
        each_ref_cell_cell_face(ref_cell, cell_face) {
          for (node = 0; node < 4; node++) {
            nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
          }
          RSS(ref_face_add_uniquely(ref_face, nodes), "add face");
        }
      }
    }
  } else {
    each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
      each_ref_cell_valid_cell(ref_cell, cell) {
        each_ref_cell_cell_face(ref_cell, cell_face) {
          for (node = 0; node < 4; node++) {
            nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
          }
          RSS(ref_face_add_uniquely(ref_face, nodes), "add face");
        }
      }
    }
  }

  return REF_SUCCESS;
}